

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool pendingDispose)

{
  Recycler *this_00;
  code *pcVar1;
  anon_class_32_4_66517344 fn;
  Type this_01;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  FreeObject *pFVar9;
  FreeObject *pFVar10;
  undefined4 extraout_var;
  byte *pbVar11;
  byte *corruptedAddress;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar12;
  undefined8 *in_FS_OFFSET;
  bool local_2a9;
  bool local_28e;
  bool local_28d;
  bool local_279;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *local_278;
  HeapBlock *nextFreeHeapBlock;
  char *nextFree_1;
  char *nextFree;
  uint i;
  FreeObject *pFStack_230;
  uint objectBitDelta;
  char *memBlock;
  Recycler *recycler;
  SmallHeapBlockBitVector tempPending;
  SmallHeapBlockBitVector *free;
  SmallHeapBlockBitVector tempFree;
  ushort verifyFinalizeCount;
  bool pendingDispose_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  tempFree.data[0x1f].word._4_2_ = 0;
  tempFree.data[0x1f].word._7_1_ = pendingDispose;
  BVStatic<2048UL>::BVStatic((BVStatic<2048UL> *)&free);
  tempPending.data[0x1f].word = (Type)&free;
  BVStatic<2048UL>::BVStatic((BVStatic<2048UL> *)&recycler);
  BuildFreeBitVector(this,(SmallHeapBlockBitVector *)tempPending.data[0x1f].word);
  this_00 = this->heapBucket->heapInfo->recycler;
  pFStack_230 = (FreeObject *)GetAddress(this);
  uVar4 = GetObjectBitDelta(this);
  uVar5 = (uint)uVar4;
  local_279 = true;
  if ((tempFree.data[0x1f].word._7_1_ & 1) != 0) {
    local_279 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
  }
  pcVar8 = GetAddress(this);
  Recycler::VerifyCheck
            ((uint)local_279,
             L"Non-finalizable block shouldn\'t be disposing. May have corrupted block type.",pcVar8
             ,&(this->super_HeapBlock).heapBlockType);
  bVar2 = HasPendingDisposeObjects(this);
  if (bVar2) {
    if ((tempFree.data[0x1f].word._7_1_ & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x825,"(pendingDispose)","pendingDispose");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    pSVar12 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    fn.free = (SmallHeapBlockBitVector **)(tempPending.data + 0x1f);
    fn.this = this;
    fn.tempPending = (SmallHeapBlockBitVector *)&recycler;
    fn.verifyFinalizeCount = (ushort *)((long)&tempFree.data[0x1f].word + 4);
    SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(bool)::_lambda(unsigned_int)_1_>
              (pSVar12,fn);
  }
  nextFree._4_4_ = 0;
  do {
    if (this->objectCount <= nextFree._4_4_) {
      bVar2 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
      if (bVar2) {
        pSVar12 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                            (&this->super_HeapBlock);
        bVar2 = pSVar12->finalizeCount == tempFree.data[0x1f].word._4_2_;
        pcVar8 = GetAddress(this);
        pSVar12 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                            (&this->super_HeapBlock);
        Recycler::VerifyCheck
                  ((uint)bVar2,L"SmallHeapBlock finalize count mismatch",pcVar8,
                   &pSVar12->finalizeCount);
      }
      else if (tempFree.data[0x1f].word._4_2_ != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x876,"(verifyFinalizeCount == 0)","verifyFinalizeCount == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      return;
    }
    BVar3 = BVStatic<2048UL>::Test
                      ((BVStatic<2048UL> *)tempPending.data[0x1f].word,nextFree._4_4_ * uVar5);
    if (BVar3 == '\0') {
      BVar3 = BVStatic<2048UL>::Test(&this->explicitFreeBits,nextFree._4_4_ * uVar5);
      if (BVar3 == '\0') {
        uVar6 = GetObjectSize(this);
        Recycler::VerifyCheckPad(this_00,pFStack_230,(ulong)uVar6);
      }
      else {
        pFVar9 = FreeObject::GetNext(pFStack_230);
        local_278 = this;
        if (pFVar9 != (FreeObject *)0x0) {
          local_278 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                      Recycler::FindHeapBlock(this_00,pFVar9);
        }
        local_2a9 = true;
        if (pFVar9 != (FreeObject *)0x0) {
          if (((FreeObject *)(this->super_HeapBlock).address <= pFVar9) &&
             (pFVar10 = (FreeObject *)GetEndAddress(this), pFVar9 < pFVar10)) {
            uVar4 = GetAddressBitIndex(pFVar9);
            BVar3 = BVStatic<2048UL>::Test(&this->explicitFreeBits,(uint)uVar4);
            local_2a9 = true;
            if (BVar3 != '\0') goto LAB_002a1146;
          }
          iVar7 = (*(local_278->super_HeapBlock)._vptr_HeapBlock[9])(local_278,pFVar9);
          local_2a9 = CONCAT44(extraout_var,iVar7) == (ulong)this->objectSize;
        }
LAB_002a1146:
        Recycler::VerifyCheck
                  ((uint)local_2a9,L"SmallHeapBlock memory written to after freed",pFStack_230,
                   pFStack_230);
        uVar6 = GetObjectSize(this);
        Recycler::VerifyCheckPadExplicitFreeList(this_00,pFStack_230,(ulong)uVar6);
      }
      pbVar11 = ObjectInfo(this,nextFree._4_4_);
      if ((*pbVar11 & 0x80) != 0) {
        bVar2 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
        if (bVar2) {
          tempFree.data[0x1f].word._4_2_ = tempFree.data[0x1f].word._4_2_ + 1;
        }
        else {
          pcVar8 = GetAddress(this);
          corruptedAddress = ObjectInfo(this,nextFree._4_4_);
          Recycler::VerifyCheck
                    (0,L"Non-Finalizable block should not have finalizable objects",pcVar8,
                     corruptedAddress);
        }
      }
    }
    else {
      BVar3 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)&recycler,nextFree._4_4_ * uVar5);
      if (BVar3 == '\0') {
        pFVar9 = FreeObject::GetNext(pFStack_230);
        local_28d = true;
        if (pFVar9 != (FreeObject *)0x0) {
          local_28e = false;
          if ((FreeObject *)(this->super_HeapBlock).address <= pFVar9) {
            pFVar10 = (FreeObject *)GetEndAddress(this);
            this_01 = tempPending.data[0x1f];
            local_28e = false;
            if (pFVar9 < pFVar10) {
              uVar4 = GetAddressBitIndex(pFVar9);
              BVar3 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)this_01.word,(uint)uVar4);
              local_28e = BVar3 != '\0';
            }
          }
          local_28d = local_28e;
        }
        Recycler::VerifyCheck
                  ((uint)local_28d,L"SmallHeapBlock memory written to after freed",pFStack_230,
                   pFStack_230);
        uVar6 = GetObjectSize(this);
        Recycler::VerifyCheckFill(pFStack_230 + 1,(ulong)uVar6 - 8);
      }
    }
    uVar6 = GetObjectSize(this);
    pFStack_230 = (FreeObject *)((long)&pFStack_230->taggedNext + (ulong)uVar6);
    nextFree._4_4_ = nextFree._4_4_ + 1;
  } while( true );
}

Assistant:

void SmallHeapBlockT<TBlockAttributes>::Verify(bool pendingDispose)
{
    ushort verifyFinalizeCount = 0;
    SmallHeapBlockBitVector tempFree;
    SmallHeapBlockBitVector *free = &tempFree;
    SmallHeapBlockBitVector tempPending;
    this->BuildFreeBitVector(free);
    Recycler * recycler = this->heapBucket->heapInfo->recycler;
    char * memBlock = this->GetAddress();
    uint objectBitDelta = this->GetObjectBitDelta();
    Recycler::VerifyCheck(!pendingDispose || this->IsAnyFinalizableBlock(),
        _u("Non-finalizable block shouldn't be disposing. May have corrupted block type."),
        this->GetAddress(), (void *)&this->heapBlockType);

    if (HasPendingDisposeObjects())
    {
        Assert(pendingDispose);

        // Pending object are not free yet, they don't have memory cleared.
        this->AsFinalizableBlock<TBlockAttributes>()->ForEachPendingDisposeObject([&](uint index) {

            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));

            tempPending.Set(bitIndex);

            // We are a pending dispose block, so the finalize count hasn't been update yet.
            // Including the pending objects in the finalize count
            verifyFinalizeCount++;
        });
    }

    for (uint i = 0; i < objectCount; i++)
    {
        if (free->Test(i * objectBitDelta))
        {
            if (!tempPending.Test(i * objectBitDelta))
            {
                char * nextFree = (char *)((FreeObject *)memBlock)->GetNext();
                Recycler::VerifyCheck(nextFree == nullptr
                    || (nextFree >= address && nextFree < this->GetEndAddress()
                    && free->Test(GetAddressBitIndex(nextFree))),
                    _u("SmallHeapBlock memory written to after freed"), memBlock, memBlock);
                Recycler::VerifyCheckFill(memBlock + sizeof(FreeObject), this->GetObjectSize() - sizeof(FreeObject));
            }
        }
        else
        {
            if (explicitFreeBits.Test(i * objectBitDelta))
            {
                char * nextFree = (char *)((FreeObject *)memBlock)->GetNext();

                HeapBlock* nextFreeHeapBlock = this;

                if (nextFree != nullptr)
                {
                    nextFreeHeapBlock = recycler->FindHeapBlock(nextFree);
                }

                Recycler::VerifyCheck(nextFree == nullptr
                    || (nextFree >= address && nextFree < this->GetEndAddress()
                    && explicitFreeBits.Test(GetAddressBitIndex(nextFree)))
                    || nextFreeHeapBlock->GetObjectSize(nextFree) == this->objectSize,
                    _u("SmallHeapBlock memory written to after freed"), memBlock, memBlock);
                recycler->VerifyCheckPadExplicitFreeList(memBlock, this->GetObjectSize());
            }
            else
            {
                recycler->VerifyCheckPad(memBlock, this->GetObjectSize());
            }

            if ((this->ObjectInfo(i) & FinalizeBit) != 0)
            {
                if (this->IsAnyFinalizableBlock())
                {
                    verifyFinalizeCount++;
                }
                else
                {
                    Recycler::VerifyCheck(false, _u("Non-Finalizable block should not have finalizable objects"),
                        this->GetAddress(), &this->ObjectInfo(i));
                }
            }

        }
        memBlock += this->GetObjectSize();
    }

    if (this->IsAnyFinalizableBlock())
    {
        Recycler::VerifyCheck(this->AsFinalizableBlock<TBlockAttributes>()->finalizeCount == verifyFinalizeCount,
            _u("SmallHeapBlock finalize count mismatch"), this->GetAddress(), &this->AsFinalizableBlock<TBlockAttributes>()->finalizeCount);
    }
    else
    {
        Assert(verifyFinalizeCount == 0);
    }
}